

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord2f *value)

{
  bool bVar1;
  reference pvVar2;
  array<float,_2UL> local_28;
  float2 v;
  texcoord2f *value_local;
  AsciiParser *this_local;
  
  v._M_elems = (_Type)value;
  bVar1 = ParseBasicTypeTuple<float,2ul>(this,&local_28);
  if (bVar1) {
    pvVar2 = ::std::array<float,_2UL>::operator[](&local_28,0);
    *(value_type_conflict6 *)v._M_elems = *pvVar2;
    pvVar2 = ::std::array<float,_2UL>::operator[](&local_28,1);
    *(value_type_conflict6 *)((long)v._M_elems + 4) = *pvVar2;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord2f *value) {
  value::float2 v;
  if (ParseBasicTypeTuple(&v)) {
    value->s = v[0];
    value->t = v[1];
    return true;
  }
  return false;
}